

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t al_ustr_encode_utf16(ALLEGRO_USTR *us,uint16_t *s,size_t n)

{
  uint in_EAX;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  long lVar6;
  size_t sVar7;
  int pos;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar1 = al_ustr_get_next(us,(int *)((long)&uStack_38 + 4));
  if ((int)uVar1 < 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      if (uVar1 < 0x10000) {
        lVar2 = 2;
LAB_00181dcf:
        uVar5 = (ushort)uVar1;
        lVar3 = 1;
        lVar4 = lVar6;
        if (n - 2 < (ulong)(lVar2 + lVar6 * 2)) break;
      }
      else {
        if (0x10ffff < uVar1) {
          uVar1 = 0;
          lVar2 = 0;
          goto LAB_00181dcf;
        }
        if (n - 2 < lVar6 * 2 + 4U) break;
        uVar5 = (ushort)uVar1 & 0x3ff | 0xdc00;
        lVar4 = lVar6 + 1;
        s[lVar6] = (ushort)(uVar1 + 0xff0000 >> 10) | 0xd800;
        lVar3 = 2;
      }
      lVar6 = lVar6 + lVar3;
      s[lVar4] = uVar5;
      uVar1 = al_ustr_get_next(us,(int *)((long)&uStack_38 + 4));
    } while (-1 < (int)uVar1);
  }
  if (lVar6 * 2 + 1U < n) {
    s[lVar6] = 0;
    sVar7 = lVar6 * 2 + 2;
  }
  else {
    sVar7 = lVar6 * 2;
  }
  return sVar7;
}

Assistant:

size_t al_ustr_encode_utf16(const ALLEGRO_USTR *us, uint16_t *s,
   size_t n)
{
   int pos = 0;
   size_t i = 0;
   while (1) {
      /* Used to hold one encoded UTF-16 character. */
      uint16_t encoded[2] = {0, 0};
      size_t sz;
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz = al_utf16_encode(encoded, c);
      /* Need two bytes for terminating 0. */
      if (i * 2 + sz > n - 2)
         break;
      s[i++] = encoded[0];
      if (sz == 4)
         s[i++] = encoded[1];
   }
   /* Append terminating 0 - al_ustr_get_next withheld it. */
   if (i * 2 + 1 < n)
      s[i++] = 0;

   return i * 2;
}